

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<1,458>::ThermalPointComponents::
ThermalPointComponents<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ThermalPointComponents *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  ListRecord local_58;
  
  ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_58,begin,end,lineNumber,MAT,MF,MT);
  Type<1,_458>::ThermalPointComponents::ThermalPointComponents
            ((ThermalPointComponents *)this,&local_58);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_58.data.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

ThermalPointComponents( Iterator& begin, const Iterator& end,
                        long& lineNumber, int MAT, int MF, int MT )
  try : ThermalPointComponents(
            ListRecord( begin, end, lineNumber, MAT, MF, MT ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing a thermal point "
               "evaluation" );
    throw;
  }